

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O2

Type * __thiscall hdc::Symbol::getType(Symbol *this)

{
  SymbolKind SVar1;
  Type *pTVar2;
  
  SVar1 = this->kind;
  if (SVar1 - SYMBOL_PARAMETER < 3) {
    pTVar2 = Variable::getType((Variable *)this->descriptor);
    return pTVar2;
  }
  if (SVar1 - SYMBOL_DEF < 2) {
    pTVar2 = Def::getReturnType((Def *)this->descriptor);
    return pTVar2;
  }
  if (SVar1 == SYMBOL_CLASS) {
    pTVar2 = Class::getSelfType((Class *)this->descriptor);
    return pTVar2;
  }
  return (Type *)0x0;
}

Assistant:

Type *Symbol::getType() {
    Variable* v = nullptr;
    Class* c = nullptr;
    Def* d = nullptr;

    switch (kind) {
    case SYMBOL_PARAMETER:
    case SYMBOL_LOCAL_VARIABLE:
    case SYMBOL_CLASS_VARIABLE:
        v = (Variable*) descriptor;
        return v->getType();

    case SYMBOL_CLASS:
        c = (Class*) descriptor;
        return c->getSelfType();

    case SYMBOL_METHOD:
    case SYMBOL_DEF:
        d = (Def*) descriptor;
        //return d->getSelfType();
        return d->getReturnType(); // fix this later

    default:
        break;
    }

    return nullptr;
}